

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshControl.cpp
# Opt level: O2

void SetAllMatid(TPZGeoEl *gel,int matid)

{
  TPZGeoEl *this;
  
  this = gel;
  do {
    this->fMatId = matid;
    this = TPZGeoEl::Father(this);
  } while (this != (TPZGeoEl *)0x0);
  SetSubMatid(gel,matid);
  return;
}

Assistant:

static void SetAllMatid(TPZGeoEl *gel, int matid)
{
    gel->SetMaterialId(matid);
    TPZGeoEl *fat = gel->Father();
    while (fat) {
        fat->SetMaterialId(matid);
        fat = fat->Father();
    }
    SetSubMatid(gel, matid);
}